

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

QSize __thiscall QGraphicsView::sizeHint(QGraphicsView *this)

{
  long lVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  QSize QVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  double dVar6;
  QSize local_70;
  QRectF local_68;
  QSizeF local_48;
  double local_38;
  double dStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x490));
  if (bVar3) {
    sceneRect(&local_68,this);
    QTransform::mapRect((QRectF *)&local_48);
    dVar6 = (double)(*(short *)(lVar1 + 0x26c) * 2);
    QGuiApplication::primaryScreen();
    local_70 = (QSize)QScreen::virtualSize();
    local_68.xp = (qreal)operator*(&local_70,3.0);
    QVar4 = operator/((QSize *)&local_68,4.0);
    auVar5._0_8_ = (double)QVar4.wd.m_i.m_i;
    auVar5._8_8_ = (double)QVar4.ht.m_i.m_i;
    auVar2._8_8_ = dVar6 + dStack_30;
    auVar2._0_8_ = dVar6 + local_38;
    local_48 = (QSizeF)minpd(auVar2,auVar5);
    QVar4 = QSizeF::toSize(&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return QVar4;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QVar4 = QAbstractScrollArea::sizeHint((QAbstractScrollArea *)this);
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QSize QGraphicsView::sizeHint() const
{
    Q_D(const QGraphicsView);
    if (d->scene) {
        QSizeF baseSize = d->matrix.mapRect(sceneRect()).size();
        baseSize += QSizeF(d->frameWidth * 2, d->frameWidth * 2);
        return baseSize.boundedTo((3 * QGuiApplication::primaryScreen()->virtualSize()) / 4).toSize();
    }
    return QAbstractScrollArea::sizeHint();
}